

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_hadamard_lp_8x8_c(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  long in_RDX;
  ptrdiff_t in_RSI;
  int16_t *in_RDI;
  int j;
  int i;
  int idx_2;
  int idx_1;
  int idx;
  int16_t *tmp_buf;
  int16_t buffer2 [64];
  int16_t buffer [64];
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int16_t *local_120;
  int16_t local_118 [64];
  int16_t local_98 [64];
  long local_18;
  ptrdiff_t local_10;
  int16_t *local_8;
  
  local_120 = local_98;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_124 = 0; local_124 < 8; local_124 = local_124 + 1) {
    hadamard_col8(local_8,local_10,local_120);
    local_120 = local_120 + 8;
    local_8 = local_8 + 1;
  }
  local_120 = local_98;
  for (local_128 = 0; local_128 < 8; local_128 = local_128 + 1) {
    hadamard_col8(local_120,8,local_118 + (local_128 << 3));
    local_120 = local_120 + 1;
  }
  for (local_12c = 0; local_12c < 0x40; local_12c = local_12c + 1) {
    *(int16_t *)(local_18 + (long)local_12c * 2) = local_118[local_12c];
  }
  for (local_130 = 0; local_130 < 8; local_130 = local_130 + 1) {
    for (local_134 = 0; local_134 < 8; local_134 = local_134 + 1) {
      *(int16_t *)(local_18 + (long)(local_130 * 8 + local_134) * 2) =
           local_118[local_134 * 8 + local_130];
    }
  }
  return;
}

Assistant:

void aom_hadamard_lp_8x8_c(const int16_t *src_diff, ptrdiff_t src_stride,
                           int16_t *coeff) {
  int16_t buffer[64];
  int16_t buffer2[64];
  int16_t *tmp_buf = &buffer[0];
  for (int idx = 0; idx < 8; ++idx) {
    hadamard_col8(src_diff, src_stride, tmp_buf);  // src_diff: 9 bit
                                                   // dynamic range [-255, 255]
    tmp_buf += 8;
    ++src_diff;
  }

  tmp_buf = &buffer[0];
  for (int idx = 0; idx < 8; ++idx) {
    hadamard_col8(tmp_buf, 8, buffer2 + 8 * idx);  // tmp_buf: 12 bit
    // dynamic range [-2040, 2040]
    // buffer2: 15 bit
    // dynamic range [-16320, 16320]
    ++tmp_buf;
  }

  for (int idx = 0; idx < 64; ++idx) coeff[idx] = buffer2[idx];

  // Extra transpose to match SSE2 behavior(i.e., aom_hadamard_lp_8x8_sse2).
  for (int i = 0; i < 8; i++) {
    for (int j = 0; j < 8; j++) {
      coeff[i * 8 + j] = buffer2[j * 8 + i];
    }
  }
}